

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.h
# Opt level: O0

AffixTokenMatcherWarehouse * __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::operator=
          (AffixTokenMatcherWarehouse *this,AffixTokenMatcherWarehouse *param_1)

{
  AffixTokenMatcherWarehouse *param_1_local;
  AffixTokenMatcherWarehouse *this_local;
  
  this->fSetupData = param_1->fSetupData;
  MinusSignMatcher::operator=(&this->fMinusSign,&param_1->fMinusSign);
  PlusSignMatcher::operator=(&this->fPlusSign,&param_1->fPlusSign);
  PercentMatcher::operator=(&this->fPercent,&param_1->fPercent);
  PermilleMatcher::operator=(&this->fPermille,&param_1->fPermille);
  CombinedCurrencyMatcher::operator=(&this->fCurrency,&param_1->fCurrency);
  CodePointMatcherWarehouse::operator=(&this->fCodePoints,&param_1->fCodePoints);
  return this;
}

Assistant:

class U_I18N_API AffixTokenMatcherWarehouse : public UMemory {
  public:
    AffixTokenMatcherWarehouse() = default;  // WARNING: Leaves the object in an unusable state

    AffixTokenMatcherWarehouse(const AffixTokenMatcherSetupData* setupData);

    NumberParseMatcher& minusSign();

    NumberParseMatcher& plusSign();

    NumberParseMatcher& percent();

    NumberParseMatcher& permille();

    NumberParseMatcher& currency(UErrorCode& status);

    IgnorablesMatcher& ignorables();

    NumberParseMatcher& nextCodePointMatcher(UChar32 cp);

  private:
    // NOTE: The following field may be unsafe to access after construction is done!
    const AffixTokenMatcherSetupData* fSetupData;

    // NOTE: These are default-constructed and should not be used until initialized.
    MinusSignMatcher fMinusSign;
    PlusSignMatcher fPlusSign;
    PercentMatcher fPercent;
    PermilleMatcher fPermille;
    CombinedCurrencyMatcher fCurrency;

    // Use a child class for code point matchers, since it requires non-default operators.
    CodePointMatcherWarehouse fCodePoints;

    friend class AffixPatternMatcherBuilder;
    friend class AffixPatternMatcher;
}